

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::char_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,size_t size,align_spec *spec,char_writer f)

{
  wchar_t wVar1;
  alignment aVar2;
  type __first;
  wchar_t *__value;
  wchar_t *__first_00;
  align_spec *in_RDX;
  ulong in_RSI;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *in_RDI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  type *it;
  uint width;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb8;
  type local_30;
  uint local_24;
  align_spec *local_20;
  ulong local_18;
  char_writer local_4 [4];
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_24 = align_spec::width(in_RDX);
  if (local_18 < local_24) {
    __first = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
              reserve(in_RDI,in_stack_ffffffffffffff98);
    wVar1 = align_spec::fill(local_20);
    __value = (wchar_t *)(local_24 - local_18);
    aVar2 = align_spec::align(local_20);
    if (aVar2 == ALIGN_RIGHT) {
      std::fill_n<wchar_t*,unsigned_long,wchar_t>
                (__first,CONCAT44(wVar1,in_stack_ffffffffffffffb8),__value);
      internal::
      arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
      char_writer::operator()(local_4,(wchar_t **)&stack0xffffffffffffffc0);
    }
    else {
      aVar2 = align_spec::align(local_20);
      if (aVar2 == ALIGN_CENTER) {
        __first_00 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                               (__first,CONCAT44(wVar1,in_stack_ffffffffffffffb8),__value);
        internal::
        arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
        char_writer::operator()(local_4,(wchar_t **)&stack0xffffffffffffffc0);
        std::fill_n<wchar_t*,unsigned_long,wchar_t>
                  (__first_00,CONCAT44(wVar1,in_stack_ffffffffffffffb8),__value);
      }
      else {
        internal::
        arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
        char_writer::operator()(local_4,(wchar_t **)&stack0xffffffffffffffc0);
        std::fill_n<wchar_t*,unsigned_long,wchar_t>
                  (__first,CONCAT44(wVar1,in_stack_ffffffffffffffb8),__value);
      }
    }
  }
  else {
    local_30 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
               ::reserve(in_RDI,in_stack_ffffffffffffff98);
    internal::
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
    char_writer::operator()(local_4,&local_30);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}